

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_uint64 ma_dr_wav__metadata_process_chunk
                    (ma_dr_wav__metadata_parser *pParser,ma_dr_wav_chunk_header *pChunkHeader,
                    ma_dr_wav_metadata_type allowedMetadataTypes)

{
  char *pcVar1;
  ma_uint8 mVar2;
  ma_uint8 *pmVar3;
  long lVar4;
  uint uVar5;
  ma_bool32 mVar6;
  size_t bytesRead;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ma_dr_wav_metadata_type type;
  byte bVar13;
  long lVar14;
  ma_dr_wav_smpl_loop *pmVar15;
  byte bVar16;
  byte bVar17;
  ma_dr_wav_metadata_location location;
  size_t extra;
  ulong uVar18;
  ma_uint64 mVar19;
  ma_dr_wav_metadata *pmVar20;
  ma_uint64 mVar21;
  ma_uint8 subchunkSizeBuffer [4];
  ma_uint8 acidData [24];
  uint local_158;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 local_14c;
  undefined4 local_148;
  undefined4 local_144;
  undefined4 local_138;
  undefined4 local_134;
  ma_uint32 local_130;
  ma_uint32 local_12c;
  undefined4 local_128;
  ma_uint32 local_124;
  ma_uint32 local_120;
  uint local_11c;
  ma_uint32 local_118;
  undefined1 local_38;
  
  mVar2 = (pChunkHeader->id).fourcc[0];
  switch(mVar2) {
  case 'a':
    if ((((pChunkHeader->id).fourcc[1] != 'c') || ((pChunkHeader->id).fourcc[2] != 'i')) ||
       ((pChunkHeader->id).fourcc[3] != 'd')) goto switchD_0016345a_caseD_64;
    if (pChunkHeader->sizeInBytes != 0x18) {
      return 0;
    }
    if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
LAB_00163c1c:
      pParser->metadataCount = pParser->metadataCount + 1;
      return 0;
    }
    pmVar20 = pParser->pMetadata;
    if (pmVar20 == (ma_dr_wav_metadata *)0x0) {
LAB_00163c24:
      sVar7 = 0;
    }
    else {
      mVar21 = pParser->metadataCursor;
      sVar7 = (*pParser->onRead)(pParser->pReadSeekUserData,&local_138,0x18);
      if (sVar7 == 0x18) {
        pmVar20 = pmVar20 + mVar21;
        pmVar20->type = ma_dr_wav_metadata_type_acid;
        *(uint *)(pmVar20->data).unknown.id = local_138;
        (pmVar20->data).acid.midiUnityNote = (ma_uint16)local_134;
        (pmVar20->data).acid.reserved1 = local_134._2_2_;
        (pmVar20->data).smpl.samplePeriodNanoseconds = local_130;
        (pmVar20->data).smpl.midiUnityNote = local_12c;
        (pmVar20->data).acid.meterDenominator = (ma_uint16)local_128;
        (pmVar20->data).acid.meterNumerator = local_128._2_2_;
        (pmVar20->data).smpl.smpteFormat = local_124;
        sVar7 = 0x18;
      }
    }
    break;
  case 'b':
    if ((((pChunkHeader->id).fourcc[1] != 'e') || ((pChunkHeader->id).fourcc[2] != 'x')) ||
       ((pChunkHeader->id).fourcc[3] != 't')) goto switchD_0016345a_caseD_64;
    if (pChunkHeader->sizeInBytes < 0x25a) {
      return 0;
    }
    if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
      local_38 = 0;
      sVar7 = (*pParser->onRead)(pParser->pReadSeekUserData,&local_138,0x100);
      if (sVar7 != 0x100) {
        return sVar7;
      }
      if ((ma_uint8)local_138 == '\0') {
        lVar14 = -0x217;
      }
      else {
        lVar10 = -0x217;
        do {
          lVar14 = lVar10 + 1;
          pcVar1 = &stack0x000000e0 + lVar10;
          lVar10 = lVar14;
        } while (*pcVar1 != '\0');
      }
      local_118 = local_118 & 0xffffff00;
      sVar7 = (*pParser->onRead)(pParser->pReadSeekUserData,&local_138,0x20);
      if (sVar7 == 0x20) {
        if ((ma_uint8)local_138 == '\0') {
          lVar10 = 0;
        }
        else {
          lVar11 = 0;
          do {
            lVar10 = lVar11 + 1;
            lVar12 = lVar11 + 1;
            lVar11 = lVar10;
          } while (*(char *)((long)&local_138 + lVar12) != '\0');
        }
        local_118 = local_118 & 0xffffff00;
        sVar8 = (*pParser->onRead)(pParser->pReadSeekUserData,&local_138,0x20);
        mVar21 = sVar7 + 0x100 + sVar8;
        if (sVar8 == 0x20) {
          if ((ma_uint8)local_138 == '\0') {
            lVar11 = 0;
          }
          else {
            lVar12 = 0;
            do {
              lVar11 = lVar12 + 1;
              lVar4 = lVar12 + 1;
              lVar12 = lVar11;
            } while (*(char *)((long)&local_138 + lVar4) != '\0');
          }
          pParser->extraCapacity =
               pParser->extraCapacity + lVar14 + lVar10 + lVar11 + pChunkHeader->sizeInBytes;
          pParser->metadataCount = pParser->metadataCount + 1;
          return mVar21;
        }
        return mVar21;
      }
      return sVar7 + 0x100;
    }
    sVar7 = ma_dr_wav__read_bext_to_metadata_obj
                      (pParser,pParser->pMetadata + pParser->metadataCursor,
                       pChunkHeader->sizeInBytes);
    goto LAB_00163785;
  case 'c':
    if ((((pChunkHeader->id).fourcc[1] != 'u') || ((pChunkHeader->id).fourcc[2] != 'e')) ||
       ((pChunkHeader->id).fourcc[3] != ' ')) goto switchD_0016345a_caseD_64;
    uVar18 = pChunkHeader->sizeInBytes;
    if (uVar18 < 4) {
      return 0;
    }
    if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
      pParser->metadataCount = pParser->metadataCount + 1;
      pParser->extraCapacity =
           ~((((uVar18 - 4) / 3 & 0xfffffffffffffff8) * -3 + uVar18) - 4) + uVar18 +
           pParser->extraCapacity + 4;
      return 0;
    }
    sVar7 = ma_dr_wav__read_cue_to_metadata_obj
                      (pParser,pChunkHeader,pParser->pMetadata + pParser->metadataCursor);
LAB_00163785:
    if (sVar7 != pChunkHeader->sizeInBytes) {
      return sVar7;
    }
    goto LAB_00163c31;
  case 'd':
  case 'e':
  case 'f':
  case 'g':
  case 'h':
  case 'j':
  case 'k':
    goto switchD_0016345a_caseD_64;
  case 'i':
    if ((((pChunkHeader->id).fourcc[1] != 'n') || ((pChunkHeader->id).fourcc[2] != 's')) ||
       ((pChunkHeader->id).fourcc[3] != 't')) goto switchD_0016345a_caseD_64;
    if (pChunkHeader->sizeInBytes != 7) {
      return 0;
    }
    if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) goto LAB_00163c1c;
    pmVar20 = pParser->pMetadata;
    if (pmVar20 == (ma_dr_wav_metadata *)0x0) goto LAB_00163c24;
    mVar21 = pParser->metadataCursor;
    sVar7 = (*pParser->onRead)(pParser->pReadSeekUserData,&local_138,7);
    if (sVar7 == 7) {
      pmVar20 = pmVar20 + mVar21;
      pmVar20->type = ma_dr_wav_metadata_type_inst;
      (pmVar20->data).inst.midiUnityNote = (ma_uint8)local_138;
      (pmVar20->data).inst.fineTuneCents = local_138._1_1_;
      (pmVar20->data).inst.gainDecibels = local_138._2_1_;
      (pmVar20->data).inst.lowNote = local_138._3_1_;
      (pmVar20->data).inst.highNote = (ma_int8)local_134;
      (pmVar20->data).inst.lowVelocity = local_134._1_1_;
      (pmVar20->data).inst.highVelocity = local_134._2_1_;
      sVar7 = 7;
    }
    break;
  case 'l':
    if ((((pChunkHeader->id).fourcc[1] == 'i') && ((pChunkHeader->id).fourcc[2] == 's')) &&
       ((pChunkHeader->id).fourcc[3] == 't')) {
LAB_0016388c:
      location = ma_dr_wav_metadata_location_invalid;
      if (pChunkHeader->sizeInBytes == 0) {
        return 0;
      }
      mVar21 = 0;
      do {
        sVar7 = (*pParser->onRead)(pParser->pReadSeekUserData,&local_138,4);
        mVar21 = mVar21 + sVar7;
        if (sVar7 != 4) {
          return mVar21;
        }
        if ((local_138 & 0xff) == 0x49) {
          if (((local_138._1_1_ != 'N') || (local_138._2_1_ != 'F')) || (local_138._3_1_ != 'O'))
          goto LAB_0016390c;
          location = ma_dr_wav_metadata_location_inside_info_list;
        }
        else if ((((local_138 & 0xff) == 0x61) && (local_138._1_1_ == 'd')) &&
                ((local_138._2_1_ == 't' && (local_138._3_1_ == 'l')))) {
          location = ma_dr_wav_metadata_location_inside_adtl_list;
        }
        else {
LAB_0016390c:
          sVar7 = (*pParser->onRead)(pParser->pReadSeekUserData,&local_158,4);
          uVar5 = local_158;
          mVar19 = mVar21 + sVar7;
          if (sVar7 != 4) {
            return mVar19;
          }
          uVar18 = (ulong)local_158;
          if ((local_138 & 0xff) == 0x6c) {
            if (local_138._3_1_ == 0x6c && (local_138._2_1_ == 0x62 && local_138._1_1_ == 0x61)) {
LAB_001639c9:
              if (3 < local_158) {
                if (pParser->stage != ma_dr_wav__metadata_parser_stage_count) {
                  uVar9 = ma_dr_wav__read_list_label_or_note_to_metadata_obj
                                    (pParser,pParser->pMetadata + pParser->metadataCursor,uVar18,
                                     (uint)((local_138 & 0xff) != 0x6c) * 0x40 +
                                     ma_dr_wav_metadata_type_list_label);
                  goto LAB_001639fe;
                }
                pParser->metadataCount = pParser->metadataCount + 1;
                mVar21 = (pParser->extraCapacity + uVar18) - 4;
LAB_00163aba:
                pParser->extraCapacity = mVar21;
              }
LAB_00163abe:
              uVar9 = 0;
              goto LAB_00163b94;
            }
            if (local_138._3_1_ != 0x74 || (local_138._2_1_ != 0x78 || local_138._1_1_ != 0x74)) {
LAB_00163b83:
              uVar9 = ma_dr_wav__metadata_process_unknown_chunk
                                (pParser,(ma_uint8 *)&local_138,uVar18,location);
              goto LAB_00163b94;
            }
            if (local_158 < 0x14) goto LAB_00163abe;
            if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
              pParser->metadataCount = pParser->metadataCount + 1;
              mVar21 = (pParser->extraCapacity + uVar18) - 0x14;
              goto LAB_00163aba;
            }
            uVar9 = ma_dr_wav__read_list_labelled_cue_region_to_metadata_obj
                              (pParser,pParser->pMetadata + pParser->metadataCursor,uVar18);
LAB_001639fe:
            if (uVar9 != uVar18) goto LAB_00163b94;
            pParser->metadataCursor = pParser->metadataCursor + 1;
LAB_00163bb1:
            mVar21 = mVar19 + uVar18;
          }
          else {
            if ((local_138 & 0xff) != 0x49) {
              if ((((local_138 & 0xff) != 0x6e) || (local_138._1_1_ != 0x6f)) ||
                 ((local_138._2_1_ != 0x74 || (local_138._3_1_ != 0x65)))) goto LAB_00163b83;
              goto LAB_001639c9;
            }
            bVar17 = local_138._3_1_ ^ 0x54;
            if ((local_138._2_1_ == 0x46 && local_138._1_1_ == 0x53) && bVar17 == 0) {
              type = ma_dr_wav_metadata_type_list_info_software;
            }
            else {
              bVar16 = local_138._1_1_ ^ 0x43;
              if (local_138._3_1_ == 0x50 && (local_138._2_1_ == 0x4f && bVar16 == 0)) {
                type = ma_dr_wav_metadata_type_list_info_copyright;
              }
              else if (local_138._3_1_ == 0x4d &&
                       (local_138._2_1_ == 0x41 && local_138._1_1_ == 0x4e)) {
                type = ma_dr_wav_metadata_type_list_info_title;
              }
              else {
                bVar13 = local_138._2_1_ ^ 0x52;
                if ((local_138._1_1_ == 0x41 && bVar13 == 0) && bVar17 == 0) {
                  type = ma_dr_wav_metadata_type_list_info_artist;
                }
                else if ((local_138._2_1_ == 0x4d && bVar16 == 0) && bVar17 == 0) {
                  type = ma_dr_wav_metadata_type_list_info_comment;
                }
                else if ((bVar16 == 0 && bVar13 == 0) && (local_138._3_1_ ^ 0x44) == 0) {
                  type = ma_dr_wav_metadata_type_list_info_date;
                }
                else if (local_138._3_1_ == 0x52 &&
                         (local_138._2_1_ == 0x4e && local_138._1_1_ == 0x47)) {
                  type = ma_dr_wav_metadata_type_list_info_genre;
                }
                else if ((local_138._1_1_ == 0x50 && bVar13 == 0) && (local_138._3_1_ ^ 0x44) == 0)
                {
                  type = ma_dr_wav_metadata_type_list_info_album;
                }
                else {
                  if (local_138._3_1_ != 0x4b || (local_138._1_1_ != 0x54 || bVar13 != 0))
                  goto LAB_00163b83;
                  type = ma_dr_wav_metadata_type_list_info_tracknumber;
                }
              }
            }
            uVar9 = ma_dr_wav__metadata_process_info_text_chunk(pParser,uVar18,type);
LAB_00163b94:
            mVar21 = uVar9 + mVar19;
            if (uVar9 < uVar18) {
              mVar6 = (*pParser->onSeek)(pParser->pReadSeekUserData,uVar5 - (int)uVar9,
                                         ma_dr_wav_seek_origin_current);
              if (mVar6 == 0) {
                return mVar21;
              }
              goto LAB_00163bb1;
            }
          }
          if ((uVar5 & 1) != 0) {
            mVar6 = (*pParser->onSeek)(pParser->pReadSeekUserData,1,ma_dr_wav_seek_origin_current);
            if (mVar6 == 0) {
              return mVar21;
            }
            mVar21 = mVar21 + 1;
          }
        }
        if (pChunkHeader->sizeInBytes <= mVar21) {
          return mVar21;
        }
      } while( true );
    }
    goto switchD_0016345a_caseD_64;
  default:
    if (mVar2 == 'L') {
      if ((((pChunkHeader->id).fourcc[1] == 'I') && ((pChunkHeader->id).fourcc[2] == 'S')) &&
         ((pChunkHeader->id).fourcc[3] == 'T')) goto LAB_0016388c;
      goto switchD_0016345a_caseD_64;
    }
    if (((mVar2 != 's') || ((pChunkHeader->id).fourcc[1] != 'm')) ||
       (((pChunkHeader->id).fourcc[2] != 'p' || ((pChunkHeader->id).fourcc[3] != 'l'))))
    goto switchD_0016345a_caseD_64;
    if (pChunkHeader->sizeInBytes < 0x24) {
      return 0;
    }
    if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
      mVar6 = (*pParser->onSeek)(pParser->pReadSeekUserData,0x1c,ma_dr_wav_seek_origin_current);
      if (mVar6 == 0) {
        return 0;
      }
      sVar7 = (*pParser->onRead)(pParser->pReadSeekUserData,&local_138,4);
      if (sVar7 != 4) {
        return sVar7 + 0x1c;
      }
      uVar18 = (pChunkHeader->sizeInBytes - 0x24) / 0x18;
      if (uVar18 != local_138) {
        return 0x20;
      }
      sVar8 = (*pParser->onRead)(pParser->pReadSeekUserData,&local_138,4);
      mVar21 = sVar7 + 0x1c + sVar8;
      if (sVar8 == 4) {
        pParser->metadataCount = pParser->metadataCount + 1;
        pParser->extraCapacity = (ulong)local_138 + uVar18 * 0x18 + pParser->extraCapacity + 7;
        return mVar21;
      }
      return mVar21;
    }
    pmVar20 = pParser->pMetadata;
    if (pmVar20 == (ma_dr_wav_metadata *)0x0) goto LAB_00163c24;
    mVar21 = pParser->metadataCursor;
    sVar7 = (*pParser->onRead)(pParser->pReadSeekUserData,&local_138,0x24);
    if (sVar7 == 0x24) {
      pmVar20 = pmVar20 + mVar21;
      pmVar20->type = ma_dr_wav_metadata_type_smpl;
      *(uint *)(pmVar20->data).unknown.id = local_138;
      (pmVar20->data).smpl.productId = local_134;
      (pmVar20->data).smpl.samplePeriodNanoseconds = local_130;
      (pmVar20->data).smpl.midiUnityNote = local_12c;
      (pmVar20->data).smpl.midiPitchFraction = local_128;
      (pmVar20->data).smpl.smpteFormat = local_124;
      (pmVar20->data).smpl.smpteOffset = local_120;
      (pmVar20->data).smpl.sampleLoopCount = local_11c;
      (pmVar20->data).smpl.samplerSpecificDataSizeInBytes = local_118;
      sVar7 = 0x24;
      if ((pChunkHeader->sizeInBytes - 0x24) / 0x18 == (ulong)local_11c) {
        uVar18 = (ulong)((uint)pParser->pDataCursor & 7);
        lVar14 = 8 - uVar18;
        if (uVar18 == 0) {
          lVar14 = 0;
        }
        pmVar15 = (ma_dr_wav_smpl_loop *)(pParser->pDataCursor + lVar14);
        pParser->pDataCursor = (ma_uint8 *)(pmVar15 + local_11c);
        (pmVar20->data).smpl.pLoops = pmVar15;
        if ((pmVar20->data).smpl.sampleLoopCount != 0) {
          lVar14 = 0;
          uVar18 = 0;
          do {
            sVar8 = (*pParser->onRead)(pParser->pReadSeekUserData,&local_158,0x18);
            sVar7 = sVar7 + sVar8;
            if (sVar8 != 0x18) break;
            *(uint *)((long)&((pmVar20->data).smpl.pLoops)->cuePointId + lVar14) = local_158;
            *(undefined4 *)((long)&((pmVar20->data).smpl.pLoops)->type + lVar14) = local_154;
            *(undefined4 *)((long)&((pmVar20->data).smpl.pLoops)->firstSampleByteOffset + lVar14) =
                 local_150;
            *(undefined4 *)((long)&((pmVar20->data).smpl.pLoops)->lastSampleByteOffset + lVar14) =
                 local_14c;
            *(undefined4 *)((long)&((pmVar20->data).smpl.pLoops)->sampleFraction + lVar14) =
                 local_148;
            *(undefined4 *)((long)&((pmVar20->data).smpl.pLoops)->playCount + lVar14) = local_144;
            uVar18 = uVar18 + 1;
            lVar14 = lVar14 + 0x18;
          } while (uVar18 < (pmVar20->data).smpl.sampleLoopCount);
        }
        uVar18 = (ulong)(pmVar20->data).smpl.samplerSpecificDataSizeInBytes;
        if (uVar18 != 0) {
          pmVar3 = pParser->pDataCursor;
          pParser->pDataCursor = pmVar3 + uVar18;
          (pmVar20->data).smpl.pSamplerSpecificData = pmVar3;
          sVar8 = (*pParser->onRead)(pParser->pReadSeekUserData,pmVar3,
                                     (size_t)(pmVar20->data).smpl.samplerSpecificDataSizeInBytes);
          sVar7 = sVar7 + sVar8;
        }
      }
    }
  }
  if (sVar7 != pChunkHeader->sizeInBytes) {
    return sVar7;
  }
LAB_00163c31:
  pParser->metadataCursor = pParser->metadataCursor + 1;
  return sVar7;
switchD_0016345a_caseD_64:
  mVar21 = ma_dr_wav__metadata_process_unknown_chunk
                     (pParser,(ma_uint8 *)pChunkHeader,pChunkHeader->sizeInBytes,
                      ma_dr_wav_metadata_location_top_level);
  return mVar21;
}

Assistant:

MA_PRIVATE ma_uint64 ma_dr_wav__metadata_process_chunk(ma_dr_wav__metadata_parser* pParser, const ma_dr_wav_chunk_header* pChunkHeader, ma_dr_wav_metadata_type allowedMetadataTypes)
{
    const ma_uint8 *pChunkID = pChunkHeader->id.fourcc;
    ma_uint64 bytesRead = 0;
    if (ma_dr_wav__chunk_matches(allowedMetadataTypes, pChunkID, ma_dr_wav_metadata_type_smpl, "smpl")) {
        if (pChunkHeader->sizeInBytes >= MA_DR_WAV_SMPL_BYTES) {
            if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                ma_uint8 buffer[4];
                size_t bytesJustRead;
                if (!pParser->onSeek(pParser->pReadSeekUserData, 28, ma_dr_wav_seek_origin_current)) {
                    return bytesRead;
                }
                bytesRead += 28;
                bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, buffer, sizeof(buffer), &bytesRead);
                if (bytesJustRead == sizeof(buffer)) {
                    ma_uint32 loopCount = ma_dr_wav_bytes_to_u32(buffer);
                    ma_uint64 calculatedLoopCount;
                    calculatedLoopCount = (pChunkHeader->sizeInBytes - MA_DR_WAV_SMPL_BYTES) / MA_DR_WAV_SMPL_LOOP_BYTES;
                    if (calculatedLoopCount == loopCount) {
                        bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, buffer, sizeof(buffer), &bytesRead);
                        if (bytesJustRead == sizeof(buffer)) {
                            ma_uint32 samplerSpecificDataSizeInBytes = ma_dr_wav_bytes_to_u32(buffer);
                            pParser->metadataCount += 1;
                            ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, sizeof(ma_dr_wav_smpl_loop) * loopCount, MA_DR_WAV_METADATA_ALIGNMENT);
                            ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, samplerSpecificDataSizeInBytes, 1);
                        }
                    } else {
                    }
                }
            } else {
                bytesRead = ma_dr_wav__read_smpl_to_metadata_obj(pParser, pChunkHeader, &pParser->pMetadata[pParser->metadataCursor]);
                if (bytesRead == pChunkHeader->sizeInBytes) {
                    pParser->metadataCursor += 1;
                } else {
                }
            }
        } else {
        }
    } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, pChunkID, ma_dr_wav_metadata_type_inst, "inst")) {
        if (pChunkHeader->sizeInBytes == MA_DR_WAV_INST_BYTES) {
            if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                pParser->metadataCount += 1;
            } else {
                bytesRead = ma_dr_wav__read_inst_to_metadata_obj(pParser, &pParser->pMetadata[pParser->metadataCursor]);
                if (bytesRead == pChunkHeader->sizeInBytes) {
                    pParser->metadataCursor += 1;
                } else {
                }
            }
        } else {
        }
    } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, pChunkID, ma_dr_wav_metadata_type_acid, "acid")) {
        if (pChunkHeader->sizeInBytes == MA_DR_WAV_ACID_BYTES) {
            if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                pParser->metadataCount += 1;
            } else {
                bytesRead = ma_dr_wav__read_acid_to_metadata_obj(pParser, &pParser->pMetadata[pParser->metadataCursor]);
                if (bytesRead == pChunkHeader->sizeInBytes) {
                    pParser->metadataCursor += 1;
                } else {
                }
            }
        } else {
        }
    } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, pChunkID, ma_dr_wav_metadata_type_cue, "cue ")) {
        if (pChunkHeader->sizeInBytes >= MA_DR_WAV_CUE_BYTES) {
            if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                size_t cueCount;
                pParser->metadataCount += 1;
                cueCount = (size_t)(pChunkHeader->sizeInBytes - MA_DR_WAV_CUE_BYTES) / MA_DR_WAV_CUE_POINT_BYTES;
                ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, sizeof(ma_dr_wav_cue_point) * cueCount, MA_DR_WAV_METADATA_ALIGNMENT);
            } else {
                bytesRead = ma_dr_wav__read_cue_to_metadata_obj(pParser, pChunkHeader, &pParser->pMetadata[pParser->metadataCursor]);
                if (bytesRead == pChunkHeader->sizeInBytes) {
                    pParser->metadataCursor += 1;
                } else {
                }
            }
        } else {
        }
    } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, pChunkID, ma_dr_wav_metadata_type_bext, "bext")) {
        if (pChunkHeader->sizeInBytes >= MA_DR_WAV_BEXT_BYTES) {
            if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                char buffer[MA_DR_WAV_BEXT_DESCRIPTION_BYTES + 1];
                size_t allocSizeNeeded = MA_DR_WAV_BEXT_UMID_BYTES;
                size_t bytesJustRead;
                buffer[MA_DR_WAV_BEXT_DESCRIPTION_BYTES] = '\0';
                bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, buffer, MA_DR_WAV_BEXT_DESCRIPTION_BYTES, &bytesRead);
                if (bytesJustRead != MA_DR_WAV_BEXT_DESCRIPTION_BYTES) {
                    return bytesRead;
                }
                allocSizeNeeded += ma_dr_wav__strlen(buffer) + 1;
                buffer[MA_DR_WAV_BEXT_ORIGINATOR_NAME_BYTES] = '\0';
                bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, buffer, MA_DR_WAV_BEXT_ORIGINATOR_NAME_BYTES, &bytesRead);
                if (bytesJustRead != MA_DR_WAV_BEXT_ORIGINATOR_NAME_BYTES) {
                    return bytesRead;
                }
                allocSizeNeeded += ma_dr_wav__strlen(buffer) + 1;
                buffer[MA_DR_WAV_BEXT_ORIGINATOR_REF_BYTES] = '\0';
                bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, buffer, MA_DR_WAV_BEXT_ORIGINATOR_REF_BYTES, &bytesRead);
                if (bytesJustRead != MA_DR_WAV_BEXT_ORIGINATOR_REF_BYTES) {
                    return bytesRead;
                }
                allocSizeNeeded += ma_dr_wav__strlen(buffer) + 1;
                allocSizeNeeded += (size_t)pChunkHeader->sizeInBytes - MA_DR_WAV_BEXT_BYTES;
                ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, allocSizeNeeded, 1);
                pParser->metadataCount += 1;
            } else {
                bytesRead = ma_dr_wav__read_bext_to_metadata_obj(pParser, &pParser->pMetadata[pParser->metadataCursor], pChunkHeader->sizeInBytes);
                if (bytesRead == pChunkHeader->sizeInBytes) {
                    pParser->metadataCursor += 1;
                } else {
                }
            }
        } else {
        }
    } else if (ma_dr_wav_fourcc_equal(pChunkID, "LIST") || ma_dr_wav_fourcc_equal(pChunkID, "list")) {
        ma_dr_wav_metadata_location listType = ma_dr_wav_metadata_location_invalid;
        while (bytesRead < pChunkHeader->sizeInBytes) {
            ma_uint8 subchunkId[4];
            ma_uint8 subchunkSizeBuffer[4];
            ma_uint64 subchunkDataSize;
            ma_uint64 subchunkBytesRead = 0;
            ma_uint64 bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, subchunkId, sizeof(subchunkId), &bytesRead);
            if (bytesJustRead != sizeof(subchunkId)) {
                break;
            }
            if (ma_dr_wav_fourcc_equal(subchunkId, "adtl")) {
                listType = ma_dr_wav_metadata_location_inside_adtl_list;
                continue;
            } else if (ma_dr_wav_fourcc_equal(subchunkId, "INFO")) {
                listType = ma_dr_wav_metadata_location_inside_info_list;
                continue;
            }
            bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, subchunkSizeBuffer, sizeof(subchunkSizeBuffer), &bytesRead);
            if (bytesJustRead != sizeof(subchunkSizeBuffer)) {
                break;
            }
            subchunkDataSize = ma_dr_wav_bytes_to_u32(subchunkSizeBuffer);
            if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_label, "labl") || ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_note, "note")) {
                if (subchunkDataSize >= MA_DR_WAV_LIST_LABEL_OR_NOTE_BYTES) {
                    ma_uint64 stringSizeWithNullTerm = subchunkDataSize - MA_DR_WAV_LIST_LABEL_OR_NOTE_BYTES;
                    if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                        pParser->metadataCount += 1;
                        ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, (size_t)stringSizeWithNullTerm, 1);
                    } else {
                        subchunkBytesRead = ma_dr_wav__read_list_label_or_note_to_metadata_obj(pParser, &pParser->pMetadata[pParser->metadataCursor], subchunkDataSize, ma_dr_wav_fourcc_equal(subchunkId, "labl") ? ma_dr_wav_metadata_type_list_label : ma_dr_wav_metadata_type_list_note);
                        if (subchunkBytesRead == subchunkDataSize) {
                            pParser->metadataCursor += 1;
                        } else {
                        }
                    }
                } else {
                }
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_labelled_cue_region, "ltxt")) {
                if (subchunkDataSize >= MA_DR_WAV_LIST_LABELLED_TEXT_BYTES) {
                    ma_uint64 stringSizeWithNullTerminator = subchunkDataSize - MA_DR_WAV_LIST_LABELLED_TEXT_BYTES;
                    if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                        pParser->metadataCount += 1;
                        ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, (size_t)stringSizeWithNullTerminator, 1);
                    } else {
                        subchunkBytesRead = ma_dr_wav__read_list_labelled_cue_region_to_metadata_obj(pParser, &pParser->pMetadata[pParser->metadataCursor], subchunkDataSize);
                        if (subchunkBytesRead == subchunkDataSize) {
                            pParser->metadataCursor += 1;
                        } else {
                        }
                    }
                } else {
                }
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_software, "ISFT")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_software);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_copyright, "ICOP")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_copyright);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_title, "INAM")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_title);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_artist, "IART")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_artist);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_comment, "ICMT")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_comment);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_date, "ICRD")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_date);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_genre, "IGNR")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_genre);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_album, "IPRD")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_album);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_tracknumber, "ITRK")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_tracknumber);
            } else if ((allowedMetadataTypes & ma_dr_wav_metadata_type_unknown) != 0) {
                subchunkBytesRead = ma_dr_wav__metadata_process_unknown_chunk(pParser, subchunkId, subchunkDataSize, listType);
            }
            bytesRead += subchunkBytesRead;
            MA_DR_WAV_ASSERT(subchunkBytesRead <= subchunkDataSize);
            if (subchunkBytesRead < subchunkDataSize) {
                ma_uint64 bytesToSeek = subchunkDataSize - subchunkBytesRead;
                if (!pParser->onSeek(pParser->pReadSeekUserData, (int)bytesToSeek, ma_dr_wav_seek_origin_current)) {
                    break;
                }
                bytesRead += bytesToSeek;
            }
            if ((subchunkDataSize % 2) == 1) {
                if (!pParser->onSeek(pParser->pReadSeekUserData, 1, ma_dr_wav_seek_origin_current)) {
                    break;
                }
                bytesRead += 1;
            }
        }
    } else if ((allowedMetadataTypes & ma_dr_wav_metadata_type_unknown) != 0) {
        bytesRead = ma_dr_wav__metadata_process_unknown_chunk(pParser, pChunkID, pChunkHeader->sizeInBytes, ma_dr_wav_metadata_location_top_level);
    }
    return bytesRead;
}